

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

void penguinV::BitwiseOr(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                        uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
                        uint32_t width,uint32_t height)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  BitwiseOrForm4 func;
  uint8_t local_b1;
  ImageManager manager;
  
  this = ImageTypeManager::instance();
  pFVar2 = ImageTypeManager::functionTable(this,in1->_type);
  local_b1 = in1->_type;
  func = pFVar2->BitwiseOr;
  if (func == (BitwiseOrForm4)0x0) {
    bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar1) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      for (; manager._registrator !=
             (ImageTypeManager *)
             manager._input.
             super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
          manager._registrator =
               (ImageTypeManager *)
               &((manager._registrator)->_functionTableMap)._M_t._M_impl.field_0x1) {
        pFVar2 = ImageTypeManager::functionTable
                           (this,*(uint8_t *)
                                  &((manager._registrator)->_functionTableMap)._M_t._M_impl);
        func = pFVar2->BitwiseOr;
        if (func != (BitwiseOrForm4)0x0) {
          local_b1 = *(uint8_t *)&((manager._registrator)->_functionTableMap)._M_t._M_impl;
          goto LAB_00118f5f;
        }
      }
      func = (BitwiseOrForm4)0x0;
LAB_00118f5f:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&manager);
    }
    else {
      func = (BitwiseOrForm4)0x0;
    }
  }
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)func,"BitwiseOr");
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = local_b1;
  (*func)(in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  anon_unknown.dwarf_a4e46::ImageManager::~ImageManager(&manager);
  return;
}

Assistant:

void BitwiseOr( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                    Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        initialize( in1, BitwiseOr )
        func( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
    }